

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall GlobOpt::CopyValue(GlobOpt *this,Value *value,ValueNumber valueNumber)

{
  JitArenaAllocator *alloc;
  ValueInfo *pVVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Value *pVVar5;
  
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1059,"(value)","value");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  alloc = this->alloc;
  ValueInfo::SetIsShared(value->valueInfo);
  pVVar1 = value->valueInfo;
  pVVar5 = (Value *)new<Memory::JitArenaAllocator>(0x10,alloc,0x3eba5c);
  pVVar5->valueNumber = valueNumber;
  pVVar5->valueInfo = pVVar1;
  return pVVar5;
}

Assistant:

Value *GlobOpt::CopyValue(Value const *const value, const ValueNumber valueNumber)
{
    Assert(value);

    return value->Copy(alloc, valueNumber);
}